

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint uVar1;
  uint uVar2;
  container_t *c;
  uint in_EDX;
  uint in_ESI;
  roaring_array_t *in_RDI;
  uint32_t unaff_retaddr;
  uint8_t unaff_retaddr_00;
  container_t *in_stack_00000008;
  uint8_t new_type;
  container_t *new_container;
  uint32_t container_max;
  uint32_t container_min;
  int32_t dst;
  int32_t src;
  uint32_t max_key;
  uint32_t min_key;
  roaring_array_t *ra;
  int32_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  ushort in_stack_ffffffffffffffc0;
  uint16_t in_stack_ffffffffffffffc2;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar3;
  uint8_t in_stack_ffffffffffffffc7;
  uint16_t *in_stack_ffffffffffffffc8;
  int local_28;
  int local_24;
  roaring_array_t *prVar4;
  
  if (in_ESI <= in_EDX) {
    uVar1 = in_ESI >> 0x10;
    uVar2 = in_EDX >> 0x10;
    prVar4 = in_RDI;
    local_28 = count_less(in_stack_ffffffffffffffc8,
                          CONCAT13(in_stack_ffffffffffffffc7,
                                   CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                          in_stack_ffffffffffffffc2);
    local_24 = local_28;
    while( true ) {
      uVar3 = false;
      if (local_24 < in_RDI->size) {
        uVar3 = in_RDI->keys[local_24] <= uVar2;
      }
      if ((bool)uVar3 == false) break;
      if (uVar1 == in_RDI->keys[local_24]) {
        in_stack_ffffffffffffffc0 = (ushort)in_ESI;
      }
      else {
        in_stack_ffffffffffffffc0 = 0;
      }
      in_stack_ffffffffffffffc2 = 0;
      if (uVar2 == in_RDI->keys[local_24]) {
        in_stack_ffffffffffffffbc = in_EDX & 0xffff;
      }
      else {
        in_stack_ffffffffffffffbc = 0xffff;
      }
      ra_unshare_container_at_index
                ((roaring_array_t *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffc4,
                                                  (uint)in_stack_ffffffffffffffc0))),0);
      c = container_remove_range
                    (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                     (uint32_t)((ulong)prVar4 >> 0x20),(uint8_t *)CONCAT44(in_ESI,in_EDX));
      if (c != in_RDI->containers[local_24]) {
        container_free((container_t *)
                       CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffc4,
                                                        CONCAT22(in_stack_ffffffffffffffc2,
                                                                 in_stack_ffffffffffffffc0)))),
                       (uint8_t)(in_stack_ffffffffffffffbc >> 0x18));
      }
      if (c != (container_t *)0x0) {
        ra_replace_key_and_container_at_index
                  (in_RDI,local_28,in_RDI->keys[local_24],c,in_stack_ffffffffffffffc7);
        local_28 = local_28 + 1;
      }
      local_24 = local_24 + 1;
    }
    if (local_28 < local_24) {
      ra_shift_tail((roaring_array_t *)
                    CONCAT17(in_stack_ffffffffffffffc7,
                             (uint7)CONCAT24(in_stack_ffffffffffffffc4,
                                             CONCAT22(in_stack_ffffffffffffffc2,
                                                      in_stack_ffffffffffffffc0))),
                    in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min,
                                        uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, (uint16_t)min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min =
            (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max =
            (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, (uint16_t)src);
        container_t *new_container;
        uint8_t new_type;
        new_container =
            container_remove_range(ra->containers[src], ra->typecodes[src],
                                   container_min, container_max, &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src], ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}